

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_resize.c
# Opt level: O0

void * mpt_queue_resize(mpt_queue *queue,size_t len)

{
  void *pvVar1;
  void *data;
  size_t len_local;
  mpt_queue *queue_local;
  
  if (len == 0) {
    free(queue->base);
    queue->base = (void *)0x0;
    queue->max = 0;
    queue->off = 0;
    queue->len = 0;
  }
  else if (len < queue->max) {
    if (len < queue->len) {
      mpt_queue_crop(queue,0,queue->len - len);
    }
    mpt_queue_align(queue,0);
    pvVar1 = realloc(queue->base,len);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    queue->base = pvVar1;
    queue->max = len;
  }
  else if (queue->max < len) {
    if (queue->max - queue->len < queue->off) {
      mpt_queue_align(queue,0);
    }
    pvVar1 = realloc(queue->base,len);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    queue->base = pvVar1;
    queue->max = len;
  }
  return queue->base;
}

Assistant:

extern void *mpt_queue_resize(MPT_STRUCT(queue) *queue, size_t len)
{
	void *data;
	
	if (!len) {
		free(queue->base);
		queue->base = 0;
		queue->len = queue->off = queue->max = 0;
	}
	/* remove data from queue start */
	else if (len < queue->max) {
		if (len < queue->len) {
			mpt_queue_crop(queue, 0, queue->len - len);
		}
		mpt_queue_align(queue, 0);
		if (!(data = realloc(queue->base, len))) {
			return 0;
		}
		queue->base = data;
		queue->max  = len;
	}
	/* enlarge data area */
	else if (len > queue->max) {
		if (MPT_queue_frag(queue)) {
			mpt_queue_align(queue, 0);
		}
		if (!(data = realloc(queue->base, len))) {
			return 0;
		}
		queue->base = data;
		queue->max  = len;
	}
	return queue->base;
}